

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  ssize_t sVar9;
  void *pvVar10;
  FILE *__stream;
  char *pcVar11;
  __off_t _Var12;
  FILE *list;
  long lStack_6008;
  boolean rewrite_directory;
  long fsiz;
  long flen;
  long slen;
  long dir_size;
  int nfiles;
  int out;
  int fd;
  char buf_1 [8192];
  libdir ld [250];
  int local_208c;
  undefined1 local_2088 [4];
  int c;
  char buf [8192];
  long total_read;
  long remainder;
  int n;
  int f;
  library lib;
  char action;
  int verbose;
  int fseen;
  int iseen;
  int cp;
  int ap;
  int r;
  int i;
  char **argv_local;
  int argc_local;
  
  iseen = 2;
  bVar1 = false;
  bVar2 = false;
  lib.strsize._4_4_ = 0;
  lib.strsize._3_1_ = ' ';
  if (((0 < argc) && (*argv != (char *)0x0)) && (**argv != '\0')) {
    progname = *argv;
  }
  if (argc < 2) {
    usage();
  }
  for (fseen = 0; argv[1][fseen] != '\0'; fseen = fseen + 1) {
    iVar4 = iseen;
    switch(argv[1][fseen]) {
    default:
      usage();
    case '-':
      break;
    case '?':
    case 'h':
      verbose_help();
      break;
    case 'C':
      if (iseen == argc) {
        usage();
      }
      iVar5 = chdir(argv[iseen]);
      iVar4 = iseen + 1;
      if (iVar5 != 0) {
        printf("Can\'t chdir to %s\n",argv[iseen]);
        xexit(1);
        iVar4 = iseen;
      }
      break;
    case 'I':
      if (iseen == argc) {
        usage();
      }
      list_file = argv[iseen];
      if (bVar1) {
        printf("Warning: multiple I options.  Previous ignored.\n");
      }
      bVar1 = true;
      iVar4 = iseen + 1;
      break;
    case 'c':
    case 't':
    case 'x':
      if (lib.strsize._3_1_ != ' ') {
        printf("Only one of t,x,c may be specified.\n");
        usage();
      }
      lib.strsize._3_1_ = argv[1][fseen];
      break;
    case 'f':
      if (iseen == argc) {
        usage();
      }
      library_file = argv[iseen];
      if (bVar2) {
        printf("Warning: multiple f options.  Previous ignored.\n");
      }
      bVar2 = true;
      iVar4 = iseen + 1;
      break;
    case 'v':
      lib.strsize._4_4_ = 1;
    }
    iseen = iVar4;
  }
  if ((argv[iseen] != (char *)0x0) && (bVar1)) {
    printf("Too many arguments.\n");
    xexit(1);
  }
  if (lib.strsize._3_1_ != 'c') {
    if (lib.strsize._3_1_ == 't') {
      bVar3 = open_library(library_file,(library *)&n);
      if (bVar3 == '\0') {
        printf("Can\'t open dlb file\n");
        xexit(1);
      }
      for (ap = 0; (long)ap < (long)lib.sspace; ap = ap + 1) {
        if (lib.strsize._4_4_ == 0) {
          printf("%s\n",*(undefined8 *)(lib.fmark + (long)ap * 0x20));
        }
        else {
          printf("%-14s %6ld %6ld\n",*(undefined8 *)(lib.fmark + (long)ap * 0x20),
                 *(undefined8 *)(lib.fmark + (long)ap * 0x20 + 8),
                 *(undefined8 *)(lib.fmark + (long)ap * 0x20 + 0x10));
        }
      }
      if (lib.strsize._4_4_ != 0) {
        printf("Revision:%ld  File count:%ld  String size:%ld\n",lib.nentries,lib.sspace,lib.rev);
      }
      close_library((library *)&n);
      xexit(0);
    }
    else if (lib.strsize._3_1_ != 'x') {
      printf("Internal error - action.\n");
      xexit(1);
      goto LAB_00102fb3;
    }
    bVar3 = open_library(library_file,(library *)&n);
    if (bVar3 == '\0') {
      printf("Can\'t open dlb file\n");
      xexit(1);
    }
    for (ap = 0; (long)ap < (long)lib.sspace; ap = ap + 1) {
      if (argv[iseen] == (char *)0x0) {
        iVar4 = strcmp(*(char **)(lib.fmark + (long)ap * 0x20),"Directory");
        if (iVar4 != 0) goto LAB_00102758;
      }
      else {
        local_208c = iseen;
        while ((local_208c < argc &&
               (iVar4 = strcmp(*(char **)(lib.fmark + (long)ap * 0x20),argv[local_208c]), iVar4 != 0
               ))) {
          local_208c = local_208c + 1;
        }
        if (local_208c != argc) {
LAB_00102758:
          fseek(_n,*(long *)(lib.fmark + (long)ap * 0x20 + 8),0);
          iVar4 = open(*(char **)(lib.fmark + (long)ap * 0x20),0x241,0x1a0);
          if (iVar4 < 0) {
            printf("Can\'t create \'%s\'\n",*(undefined8 *)(lib.fmark + (long)ap * 0x20));
            xexit(1);
          }
          buf[0x1ff8] = '\0';
          buf[0x1ff9] = '\0';
          buf[0x1ffa] = '\0';
          buf[0x1ffb] = '\0';
          buf[0x1ffc] = '\0';
          buf[0x1ffd] = '\0';
          buf[0x1ffe] = '\0';
          buf[0x1fff] = '\0';
          do {
            lVar7 = *(long *)(lib.fmark + (long)ap * 0x20 + 0x10) - buf._8184_8_;
            if (lVar7 < 0x2001) {
              cp = (int)lVar7;
            }
            else {
              cp = 0x2000;
            }
            sVar8 = fread(local_2088,1,(long)cp,_n);
            iVar5 = (int)sVar8;
            if (iVar5 != cp) {
              printf("Read Error in \'%s\'\n",*(undefined8 *)(lib.fmark + (long)ap * 0x20));
              xexit(1);
            }
            sVar9 = write(iVar4,local_2088,(long)iVar5);
            if (sVar9 != iVar5) {
              printf("Write Error in \'%s\'\n",*(undefined8 *)(lib.fmark + (long)ap * 0x20));
              xexit(1);
            }
            buf._8184_8_ = (long)iVar5 + buf._8184_8_;
          } while (buf._8184_8_ != *(long *)(lib.fmark + (long)ap * 0x20 + 0x10));
          close(iVar4);
          if (lib.strsize._4_4_ != 0) {
            printf("x %s\n",*(undefined8 *)(lib.fmark + (long)ap * 0x20));
          }
        }
      }
    }
    close_library((library *)&n);
    xexit(0);
  }
  dir_size._4_4_ = 0;
  bVar2 = false;
  if (argv[iseen] != (char *)0x0) {
    for (; iseen < argc; iseen = iseen + 1) {
      if (0xf9 < dir_size._4_4_) {
        printf("Too many dlb files!  Stopping at %d.\n",0xfa);
        xexit(1);
      }
      sVar8 = strlen(argv[iseen]);
      pvVar10 = malloc(sVar8 + 1);
      *(void **)&ld[(long)dir_size._4_4_ + -1].handling = pvVar10;
      strcpy(*(char **)&ld[(long)dir_size._4_4_ + -1].handling,argv[iseen]);
      dir_size._4_4_ = dir_size._4_4_ + 1;
    }
  }
  if (bVar1) {
    __stream = fopen(list_file,"r");
    if (__stream == (FILE *)0x0) {
      printf("Can\'t open %s\n",list_file);
      xexit(1);
    }
    while (pcVar11 = fgets((char *)&out,0x2000,__stream), pcVar11 != (char *)0x0) {
      if (0xf9 < dir_size._4_4_) {
        printf("Too many dlb files!  Stopping at %d.\n",0xfa);
        xexit(1);
      }
      pcVar11 = eos((char *)&out);
      pcVar11[-1] = '\0';
      sVar8 = strlen((char *)&out);
      pvVar10 = malloc(sVar8 + 1);
      *(void **)&ld[(long)dir_size._4_4_ + -1].handling = pvVar10;
      strcpy(*(char **)&ld[(long)dir_size._4_4_ + -1].handling,(char *)&out);
      dir_size._4_4_ = dir_size._4_4_ + 1;
    }
    fclose(__stream);
  }
  if (dir_size._4_4_ == 0) {
    printf("No files to archive\n");
    xexit(1);
  }
  flen = 0;
  fsiz = 0;
  for (ap = 0; ap < dir_size._4_4_; ap = ap + 1) {
    iVar4 = open(*(char **)&ld[(long)ap + -1].handling,0);
    if (iVar4 < 0) {
      printf("Can\'t open %s\n",*(undefined8 *)&ld[(long)ap + -1].handling);
      xexit(1);
    }
    _Var12 = lseek(iVar4,0,2);
    ld[ap].foffset = _Var12;
    ld[ap].fname = (char *)fsiz;
    sVar8 = strlen(*(char **)&ld[(long)ap + -1].handling);
    flen = sVar8 + flen;
    fsiz = ld[ap].foffset + fsiz;
    close(iVar4);
  }
  iVar4 = open(library_file,0x242,0x1b0);
  if (iVar4 < 0) {
    printf("Can\'t open %s for output\n",library_file);
    xexit(1);
  }
  lVar7 = ((dir_size._4_4_ + 1) * 0xb + 0x28) + flen + 9;
  write_dlb_directory(iVar4,dir_size._4_4_,(libdir *)(buf_1 + 0x1ff8),flen,lVar7,fsiz);
  fsiz = 0;
  for (ap = 0; ap < dir_size._4_4_; ap = ap + 1) {
    iVar5 = open(*(char **)&ld[(long)ap + -1].handling,0);
    if (iVar5 < 0) {
      printf("Can\'t open input file \'%s\'\n",*(undefined8 *)&ld[(long)ap + -1].handling);
      xexit(1);
    }
    if (lib.strsize._4_4_ != 0) {
      printf("%s\n",*(undefined8 *)&ld[(long)ap + -1].handling);
    }
    lStack_6008 = 0;
    while( true ) {
      sVar9 = read(iVar5,&out,0x2000);
      iVar6 = (int)sVar9;
      if (iVar6 == 0) break;
      if (iVar6 == -1) {
        printf("Read Error in \'%s\'\n",*(undefined8 *)&ld[(long)ap + -1].handling);
        xexit(1);
      }
      sVar9 = write(iVar4,&out,(long)iVar6);
      if (sVar9 != iVar6) {
        printf("Write Error in \'%s\'\n",*(undefined8 *)&ld[(long)ap + -1].handling);
        xexit(1);
      }
      lStack_6008 = iVar6 + lStack_6008;
    }
    close(iVar5);
    if (lStack_6008 != ld[ap].foffset) {
      bVar2 = true;
    }
    ld[ap].foffset = lStack_6008;
    ld[ap].fname = (char *)fsiz;
    fsiz = lStack_6008 + fsiz;
  }
  if (bVar2) {
    if (lib.strsize._4_4_ != 0) {
      printf("(rewriting dlb directory info)\n");
    }
    lseek(iVar4,0,0);
    write_dlb_directory(iVar4,dir_size._4_4_,(libdir *)(buf_1 + 0x1ff8),flen,lVar7,fsiz);
  }
  for (ap = 0; ap < dir_size._4_4_; ap = ap + 1) {
    free(*(void **)&ld[(long)ap + -1].handling);
    *(undefined8 *)&ld[(long)ap + -1].handling = 0;
  }
  close(iVar4);
  xexit(0);
LAB_00102fb3:
  xexit(0);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, r;
    int ap=2;				/* argument pointer */
    int cp;				/* command pointer */
    int iseen=0, fseen=0, verbose=0;	/* flags */
    char action=' ';
    library lib;

    if (argc > 0 && argv[0] && *argv[0]) progname = argv[0];

    if (argc<2) {
	usage();
	/* doesn't return */
    }

    for (cp=0; argv[1][cp]; cp++){
	switch(argv[1][cp]){
	    default:
		usage();	/* doesn't return */
	    case '-':	/* silently ignore */
		break;
	    case '?':
	    case 'h':
		verbose_help();
		break;
	    case 'I':
		if (ap == argc) usage();
		list_file=argv[ap++];
		if (iseen)
		    printf("Warning: multiple I options.  Previous ignored.\n");
		iseen=1;
		break;
	    case 'f':
		if (ap == argc) usage();
		library_file=argv[ap++];
		if (fseen)
		    printf("Warning: multiple f options.  Previous ignored.\n");
		fseen=1;
		break;
	    case 'C':
		if (ap == argc) usage();
		if (chdir(argv[ap++])){
		    printf("Can't chdir to %s\n",argv[--ap]);
		    xexit(EXIT_FAILURE);
		}
		break;
	    case 'v':
		verbose=1;
		break;
	    case 't':
	    case 'c':
	    case 'x':
		if (action != ' '){
		    printf("Only one of t,x,c may be specified.\n");
		    usage();
		}
		action=argv[1][cp];
		break;
	}
    }

    if (argv[ap] && iseen){
	printf("Too many arguments.\n");
	xexit(EXIT_FAILURE);
    }

    switch(action){
    default:
	printf("Internal error - action.\n");
	xexit(EXIT_FAILURE);
	break;
    case 't':			/* list archive */
	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (verbose)
		printf("%-14s %6ld %6ld\n",
		    lib.dir[i].fname, lib.dir[i].foffset, lib.dir[i].fsize);
	    else
		printf("%s\n", lib.dir[i].fname);
	}

	if (verbose)
	    printf("Revision:%ld  File count:%ld  String size:%ld\n",
		lib.rev, lib.nentries, lib.strsize);

	close_library(&lib);
	xexit(EXIT_SUCCESS);

    case 'x': {			/* extract archive contents */
	int f, n;
	long remainder, total_read;
	char buf[BUFSIZ];

	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (argv[ap]) {
		/* if files are listed, see if current is wanted */
		int c;
		for (c = ap; c < argc; c++)
		    if (!FILENAME_CMP(lib.dir[i].fname, argv[c])) break;
		if (c == argc) continue;	/* skip */
	    } else if (!FILENAME_CMP(lib.dir[i].fname, DLB_DIRECTORY)) {
		/*
		 * Don't extract the directory unless the user
		 * specifically asks for it.
		 *
		 * Perhaps we should never extract the directory???
		 */
		continue;
	    }
	    fseek(lib.fdata, lib.dir[i].foffset, SEEK_SET);

	    f = open(lib.dir[i].fname, O_WRONLY|O_TRUNC|O_BINARY|O_CREAT, 0640);
	    if (f < 0) {
		printf("Can't create '%s'\n", lib.dir[i].fname);
		xexit(EXIT_FAILURE);
	    }

	    /* read chunks from library and write them out */
	    total_read = 0;
	    do {
		remainder = lib.dir[i].fsize - total_read;
		if (remainder > (long) sizeof(buf))
		    r = (int) sizeof(buf);
		else
		    r = remainder;

		n = fread(buf, 1, r, lib.fdata);
		if (n != r) {
		    printf("Read Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(f, buf, n) != n) {
		    printf("Write Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}

		total_read += n;
	    } while (total_read != lib.dir[i].fsize);

	    close(f);

	    if (verbose) printf("x %s\n", lib.dir[i].fname);
	}

	close_library(&lib);
	xexit(EXIT_SUCCESS);
	}

    case 'c':			/* create archive */
	{
	libdir ld[MAX_DLB_FILES];
	char buf[BUFSIZ];
	int fd, out, nfiles = 0;
	long dir_size, slen, flen, fsiz;
	boolean rewrite_directory = FALSE;

	/*
	 * Get names from either/both an argv list and a file
	 * list.  This does not do any duplicate checking
	 */

	/* get file name in argv list */
	if (argv[ap]) {
	    for ( ; ap < argc; ap++, nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		ld[nfiles].fname = malloc(strlen(argv[ap]) + 1);
		strcpy(ld[nfiles].fname, argv[ap]);
	    }
	}

	if (iseen) {
	    /* want to do a list file */
	    FILE *list = fopen(list_file, "r");
	    if (!list) {
		printf("Can't open %s\n",list_file);
		xexit(EXIT_FAILURE);
	    }

	    /* get file names, one per line */
	    for ( ; fgets(buf, sizeof(buf), list); nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		*(eos(buf)-1) = '\0';	/* strip newline */
		ld[nfiles].fname = malloc(strlen(buf) + 1);
		strcpy(ld[nfiles].fname, buf);
	    }
	    fclose(list);
	}

	if (nfiles == 0) {
	    printf("No files to archive\n");
	    xexit(EXIT_FAILURE);
	}


	/*
	 * Get file sizes and name string length.  Don't include
	 * the directory information yet.
	 */
	for (i = 0, slen = 0, flen = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open %s\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    ld[i].fsize = lseek(fd, 0, SEEK_END);
	    ld[i].foffset = flen;

	    slen += strlen(ld[i].fname);	/* don't add null (yet) */
	    flen += ld[i].fsize;
	    close(fd);
	}

	/* open output file */
	out = open(library_file, O_RDWR|O_TRUNC|O_BINARY|O_CREAT, FCMASK);
	if (out < 0) {
	    printf("Can't open %s for output\n", library_file);
	    xexit(EXIT_FAILURE);
	}

	/* caculate directory size */
	dir_size = 40			/* header line (see below) */
		   + ((nfiles+1)*11)	/* handling+file offset+SP+newline */
		   + slen+strlen(DLB_DIRECTORY); /* file names */

	/* write directory */
	write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);

	flen = 0L;
	/* write each file */
	for (i = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open input file '%s'\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    if (verbose) printf("%s\n",ld[i].fname);

	    fsiz = 0L;
	    while ((r = read(fd, buf, sizeof buf)) != 0) {
		if (r == -1) {
		    printf("Read Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(out, buf, r) != r) {
		    printf("Write Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		fsiz += r;
	    }
	    close(fd);
	    if (fsiz != ld[i].fsize) rewrite_directory = TRUE;
	    /* in case directory rewrite is needed */
	    ld[i].fsize = fsiz;
	    ld[i].foffset = flen;
	    flen += fsiz;
	}

	if (rewrite_directory) {
	    if (verbose) printf("(rewriting dlb directory info)\n");
	    lseek(out, 0, SEEK_SET);	/* rewind */
	    write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);
	}

	for (i = 0; i < nfiles; i++)
	    free(ld[i].fname),  ld[i].fname = 0;

	close(out);
	xexit(EXIT_SUCCESS);
	}
    }

    xexit(EXIT_SUCCESS);
    /*NOTREACHED*/
    return 0;
}